

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

cmCPackIFWPackage * __thiscall
cmCPackIFWGenerator::GetGroupPackage(cmCPackIFWGenerator *this,cmCPackComponentGroup *group)

{
  bool bVar1;
  pointer ppVar2;
  cmCPackIFWPackage *local_38;
  _Self local_28;
  _Self local_20;
  const_iterator pit;
  cmCPackComponentGroup *group_local;
  cmCPackIFWGenerator *this_local;
  
  pit._M_node = (_Base_ptr)group;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<cmCPackComponentGroup_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponentGroup_*>,_std::allocator<std::pair<cmCPackComponentGroup_*const,_cmCPackIFWPackage_*>_>_>
       ::find(&this->GroupPackages,(key_type *)&pit);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<cmCPackComponentGroup_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponentGroup_*>,_std::allocator<std::pair<cmCPackComponentGroup_*const,_cmCPackIFWPackage_*>_>_>
       ::end(&this->GroupPackages);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<cmCPackComponentGroup_*const,_cmCPackIFWPackage_*>_>
             ::operator->(&local_20);
    local_38 = ppVar2->second;
  }
  else {
    local_38 = (cmCPackIFWPackage *)0x0;
  }
  return local_38;
}

Assistant:

cmCPackIFWPackage* cmCPackIFWGenerator::GetGroupPackage(
  cmCPackComponentGroup* group) const
{
  auto pit = this->GroupPackages.find(group);
  return pit != this->GroupPackages.end() ? pit->second : nullptr;
}